

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O2

int green_poller_release(green_poller_t poller)

{
  green_future_t *__ptr;
  green_future_t future;
  int iVar1;
  int iVar2;
  int i;
  ulong uVar3;
  
  fwrite("green_poller_release()\n",0x17,1,_stderr);
  if (poller == (green_poller_t)0x0) {
    iVar1 = 1;
  }
  else {
    if (poller->refs < 1) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","poller->refs > 0",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x1b9);
      fflush(_stderr);
      abort();
    }
    iVar1 = 0;
    iVar2 = poller->refs + -1;
    poller->refs = iVar2;
    if (iVar2 == 0) {
      for (uVar3 = 0; __ptr = poller->futures, uVar3 < poller->used; uVar3 = uVar3 + 1) {
        __ptr[uVar3]->poller = (green_poller_t)0x0;
        future = __ptr[uVar3];
        future->slot = -1;
        green_future_release(future);
        poller->futures[uVar3] = (green_future_t)0x0;
      }
      free(__ptr);
      free(poller);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int green_poller_release(green_poller_t poller)
{
    fprintf(stderr, "green_poller_release()\n");

    if (poller == NULL) {
        return GREEN_EINVAL;
    }
    green_assert(poller->refs > 0);
    if (--poller->refs == 0) {
        for (int i = 0; i < poller->used; ++i) {
            poller->futures[i]->poller = NULL;
            poller->futures[i]->slot = -1;
            green_future_release(poller->futures[i]);
            poller->futures[i] = NULL;
        }
        green_free(poller->futures);
        poller->futures = NULL;
        poller->loop = NULL;
        green_free(poller);
    }
    return GREEN_SUCCESS;
}